

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread_readout.c
# Opt level: O3

void print_mutex(char *define,pthread_mutex_t mutex)

{
  size_t i;
  ulong uVar1;
  
  printf("%s { {",define);
  uVar1 = 0;
  do {
    if (uVar1 == 0) {
LAB_0010137b:
      printf("\\\n    ");
    }
    else {
      putchar(0x2c);
      if ((uVar1 & 7) == 0) goto LAB_0010137b;
    }
    printf(" 0x%02hhx",(ulong)(byte)mutex.__size[uVar1]);
    uVar1 = uVar1 + 1;
    if (uVar1 == 0x28) {
      puts(" } }");
      return;
    }
  } while( true );
}

Assistant:

static void print_mutex( const char * define, pthread_mutex_t mutex )
{
    printf( "%s { {", define );

    for ( size_t i = 0; i < sizeof( pthread_mutex_t ); ++i )
    {
        if ( i > 0 )
        {
            printf( "," );
        }

        if ( !( i % 8 ) )
        {
            printf( "\\\n    " );
        }

        printf( " 0x%02hhx", ( ( unsigned char * )&mutex )[i] );
    }

    printf( " } }\n" );
}